

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

DisasASI get_asi(DisasContext_conflict8 *dc,int insn,MemOp_conflict1 memop)

{
  DisasASI DVar1;
  int local_34;
  undefined4 local_30;
  int mem_idx;
  ASIType type;
  int asi;
  MemOp_conflict1 memop_local;
  int insn_local;
  DisasContext_conflict8 *dc_local;
  
  mem_idx = insn >> 5 & 0xff;
  local_30 = 0;
  local_34 = dc->mem_idx;
  if ((insn & 0x2000U) != 0) {
    mem_idx = dc->asi;
  }
  type = memop;
  if (((dc->supervisor & 1U) == 0 && (dc->hypervisor & 1U) == 0) && (mem_idx < 0x80)) {
    gen_exception(dc,0x37);
    local_30 = 1;
  }
  else {
    switch(mem_idx) {
    case 4:
    case 0xc:
    case 0x24:
    case 0x27:
    case 0x2c:
    case 0x2f:
      if ((dc->hypervisor & 1U) == 0) {
        local_34 = 4;
      }
      else {
        local_34 = 5;
      }
      break;
    case 0x10:
    case 0x16:
    case 0x18:
    case 0x1e:
    case 0x22:
    case 0x2a:
    case 0x70:
    case 0x78:
      local_34 = 0;
      break;
    case 0x11:
    case 0x17:
    case 0x19:
    case 0x1f:
    case 0x23:
    case 0x2b:
    case 0x71:
    case 0x79:
      local_34 = 1;
      break;
    case 0x14:
    case 0x15:
    case 0x1c:
    case 0x1d:
    case 0x26:
    case 0x2e:
    case 0x34:
    case 0x3c:
      local_34 = 5;
      break;
    case 0x80:
    case 0x88:
    case 0xd0:
    case 0xd2:
    case 0xd8:
    case 0xda:
    case 0xe0:
    case 0xe2:
    case 0xea:
    case 0xf0:
    case 0xf8:
      break;
    case 0x81:
    case 0x89:
    case 0xd1:
    case 0xd3:
    case 0xd9:
    case 0xdb:
    case 0xe1:
    case 0xe3:
    case 0xeb:
    case 0xf1:
    case 0xf9:
      if (local_34 == 0) {
        local_34 = 1;
      }
      else if (local_34 == 2) {
        local_34 = 3;
      }
    }
    switch(mem_idx) {
    case 4:
    case 0xc:
    case 0x10:
    case 0x11:
    case 0x14:
    case 0x15:
    case 0x18:
    case 0x19:
    case 0x1c:
    case 0x1d:
    case 0x80:
    case 0x81:
    case 0x88:
    case 0x89:
      local_30 = 2;
      break;
    case 0x16:
    case 0x17:
    case 0x1e:
    case 0x1f:
    case 0x70:
    case 0x71:
    case 0x78:
    case 0x79:
    case 0xe0:
    case 0xe1:
    case 0xf0:
    case 0xf1:
    case 0xf8:
    case 0xf9:
      local_30 = 4;
      break;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x26:
    case 0x27:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2e:
    case 0x2f:
    case 0x34:
    case 0x3c:
    case 0xe2:
    case 0xe3:
    case 0xea:
    case 0xeb:
      local_30 = 3;
      break;
    case 0xd0:
    case 0xd1:
    case 0xd8:
    case 0xd9:
      type = GET_ASI_HELPER;
      local_30 = 5;
      break;
    case 0xd2:
    case 0xd3:
    case 0xda:
    case 0xdb:
      type = 9;
      local_30 = 5;
    }
    if ((mem_idx & 8U) != 0) {
      type = type ^ 8;
    }
  }
  DVar1.asi = mem_idx;
  DVar1.type = local_30;
  DVar1.mem_idx = local_34;
  DVar1.memop = type;
  return DVar1;
}

Assistant:

static DisasASI get_asi(DisasContext *dc, int insn, MemOp memop)
{
    int asi = GET_FIELD(insn, 19, 26);
    ASIType type = GET_ASI_HELPER;
    int mem_idx = dc->mem_idx;

#ifndef TARGET_SPARC64
    /* Before v9, all asis are immediate and privileged.  */
    if (IS_IMM) {
        gen_exception(dc, TT_ILL_INSN);
        type = GET_ASI_EXCP;
    } else if (supervisor(dc)
               /* Note that LEON accepts ASI_USERDATA in user mode, for
                  use with CASA.  Also note that previous versions of
                  QEMU allowed (and old versions of gcc emitted) ASI_P
                  for LEON, which is incorrect.  */
               || (asi == ASI_USERDATA
                   && (dc->def->features & CPU_FEATURE_CASA))) {
        switch (asi) {
        case ASI_USERDATA:   /* User data access */
            mem_idx = MMU_USER_IDX;
            type = GET_ASI_DIRECT;
            break;
        case ASI_KERNELDATA: /* Supervisor data access */
            mem_idx = MMU_KERNEL_IDX;
            type = GET_ASI_DIRECT;
            break;
        case ASI_M_BYPASS:    /* MMU passthrough */
        case ASI_LEON_BYPASS: /* LEON MMU passthrough */
            mem_idx = MMU_PHYS_IDX;
            type = GET_ASI_DIRECT;
            break;
        case ASI_M_BCOPY: /* Block copy, sta access */
            mem_idx = MMU_KERNEL_IDX;
            type = GET_ASI_BCOPY;
            break;
        case ASI_M_BFILL: /* Block fill, stda access */
            mem_idx = MMU_KERNEL_IDX;
            type = GET_ASI_BFILL;
            break;
        }

        /* MMU_PHYS_IDX is used when the MMU is disabled to passthrough the
         * permissions check in get_physical_address(..).
         */
        mem_idx = (dc->mem_idx == MMU_PHYS_IDX) ? MMU_PHYS_IDX : mem_idx;
    } else {
        gen_exception(dc, TT_PRIV_INSN);
        type = GET_ASI_EXCP;
    }
#else
    if (IS_IMM) {
        asi = dc->asi;
    }
    /* With v9, all asis below 0x80 are privileged.  */
    /* ??? We ought to check cpu_has_hypervisor, but we didn't copy
       down that bit into DisasContext.  For the moment that's ok,
       since the direct implementations below doesn't have any ASIs
       in the restricted [0x30, 0x7f] range, and the check will be
       done properly in the helper.  */
    if (!supervisor(dc) && asi < 0x80) {
        gen_exception(dc, TT_PRIV_ACT);
        type = GET_ASI_EXCP;
    } else {
        switch (asi) {
        case ASI_REAL:      /* Bypass */
        case ASI_REAL_IO:   /* Bypass, non-cacheable */
        case ASI_REAL_L:    /* Bypass LE */
        case ASI_REAL_IO_L: /* Bypass, non-cacheable LE */
        case ASI_TWINX_REAL:   /* Real address, twinx */
        case ASI_TWINX_REAL_L: /* Real address, twinx, LE */
        case ASI_QUAD_LDD_PHYS:
        case ASI_QUAD_LDD_PHYS_L:
            mem_idx = MMU_PHYS_IDX;
            break;
        case ASI_N:  /* Nucleus */
        case ASI_NL: /* Nucleus LE */
        case ASI_TWINX_N:
        case ASI_TWINX_NL:
        case ASI_NUCLEUS_QUAD_LDD:
        case ASI_NUCLEUS_QUAD_LDD_L:
            if (hypervisor(dc)) {
                mem_idx = MMU_PHYS_IDX;
            } else {
                mem_idx = MMU_NUCLEUS_IDX;
            }
            break;
        case ASI_AIUP:  /* As if user primary */
        case ASI_AIUPL: /* As if user primary LE */
        case ASI_TWINX_AIUP:
        case ASI_TWINX_AIUP_L:
        case ASI_BLK_AIUP_4V:
        case ASI_BLK_AIUP_L_4V:
        case ASI_BLK_AIUP:
        case ASI_BLK_AIUPL:
            mem_idx = MMU_USER_IDX;
            break;
        case ASI_AIUS:  /* As if user secondary */
        case ASI_AIUSL: /* As if user secondary LE */
        case ASI_TWINX_AIUS:
        case ASI_TWINX_AIUS_L:
        case ASI_BLK_AIUS_4V:
        case ASI_BLK_AIUS_L_4V:
        case ASI_BLK_AIUS:
        case ASI_BLK_AIUSL:
            mem_idx = MMU_USER_SECONDARY_IDX;
            break;
        case ASI_S:  /* Secondary */
        case ASI_SL: /* Secondary LE */
        case ASI_TWINX_S:
        case ASI_TWINX_SL:
        case ASI_BLK_COMMIT_S:
        case ASI_BLK_S:
        case ASI_BLK_SL:
        case ASI_FL8_S:
        case ASI_FL8_SL:
        case ASI_FL16_S:
        case ASI_FL16_SL:
            if (mem_idx == MMU_USER_IDX) {
                mem_idx = MMU_USER_SECONDARY_IDX;
            } else if (mem_idx == MMU_KERNEL_IDX) {
                mem_idx = MMU_KERNEL_SECONDARY_IDX;
            }
            break;
        case ASI_P:  /* Primary */
        case ASI_PL: /* Primary LE */
        case ASI_TWINX_P:
        case ASI_TWINX_PL:
        case ASI_BLK_COMMIT_P:
        case ASI_BLK_P:
        case ASI_BLK_PL:
        case ASI_FL8_P:
        case ASI_FL8_PL:
        case ASI_FL16_P:
        case ASI_FL16_PL:
            break;
        }
        switch (asi) {
        case ASI_REAL:
        case ASI_REAL_IO:
        case ASI_REAL_L:
        case ASI_REAL_IO_L:
        case ASI_N:
        case ASI_NL:
        case ASI_AIUP:
        case ASI_AIUPL:
        case ASI_AIUS:
        case ASI_AIUSL:
        case ASI_S:
        case ASI_SL:
        case ASI_P:
        case ASI_PL:
            type = GET_ASI_DIRECT;
            break;
        case ASI_TWINX_REAL:
        case ASI_TWINX_REAL_L:
        case ASI_TWINX_N:
        case ASI_TWINX_NL:
        case ASI_TWINX_AIUP:
        case ASI_TWINX_AIUP_L:
        case ASI_TWINX_AIUS:
        case ASI_TWINX_AIUS_L:
        case ASI_TWINX_P:
        case ASI_TWINX_PL:
        case ASI_TWINX_S:
        case ASI_TWINX_SL:
        case ASI_QUAD_LDD_PHYS:
        case ASI_QUAD_LDD_PHYS_L:
        case ASI_NUCLEUS_QUAD_LDD:
        case ASI_NUCLEUS_QUAD_LDD_L:
            type = GET_ASI_DTWINX;
            break;
        case ASI_BLK_COMMIT_P:
        case ASI_BLK_COMMIT_S:
        case ASI_BLK_AIUP_4V:
        case ASI_BLK_AIUP_L_4V:
        case ASI_BLK_AIUP:
        case ASI_BLK_AIUPL:
        case ASI_BLK_AIUS_4V:
        case ASI_BLK_AIUS_L_4V:
        case ASI_BLK_AIUS:
        case ASI_BLK_AIUSL:
        case ASI_BLK_S:
        case ASI_BLK_SL:
        case ASI_BLK_P:
        case ASI_BLK_PL:
            type = GET_ASI_BLOCK;
            break;
        case ASI_FL8_S:
        case ASI_FL8_SL:
        case ASI_FL8_P:
        case ASI_FL8_PL:
            memop = MO_UB;
            type = GET_ASI_SHORT;
            break;
        case ASI_FL16_S:
        case ASI_FL16_SL:
        case ASI_FL16_P:
        case ASI_FL16_PL:
            memop = MO_TEUW;
            type = GET_ASI_SHORT;
            break;
        }
        /* The little-endian asis all have bit 3 set.  */
        if (asi & 8) {
            memop ^= MO_BSWAP;
        }
    }
#endif

    return (DisasASI){ type, asi, mem_idx, memop };
}